

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O2

SVInt * __thiscall slang::SVInt::operator++(SVInt *this)

{
  bool bVar1;
  uint uVar2;
  uint64_t *dst;
  
  uVar2 = (this->super_SVIntStorage).bitWidth;
  bVar1 = (this->super_SVIntStorage).unknownFlag;
  if (uVar2 < 0x41 && (bVar1 & 1U) == 0) {
    (this->super_SVIntStorage).field_0.pVal =
         (uint64_t *)((this->super_SVIntStorage).field_0.val + 1);
  }
  else if ((bVar1 & 1U) == 0) {
    dst = (this->super_SVIntStorage).field_0.pVal;
    addOne(dst,dst,(uVar2 + 0x3f >> 6) << (bVar1 & 0x1fU),1);
  }
  else {
    setAllX(this);
  }
  clearUnusedBits(this);
  return this;
}

Assistant:

SVInt& SVInt::operator++() {
    if (isSingleWord())
        ++val;
    else if (unknownFlag)
        setAllX();
    else
        addOne(pVal, pVal, getNumWords(), 1);
    clearUnusedBits();
    return *this;
}